

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_location.cpp
# Opt level: O2

Am_Wrapper * __thiscall Am_Inter_Location_Data::Make_Unique(Am_Inter_Location_Data *this)

{
  Am_Inter_Location_Data *this_00;
  
  this_00 = this;
  if ((this->super_Am_Wrapper).refs != 1) {
    Am_Wrapper::Release(&this->super_Am_Wrapper);
    this_00 = (Am_Inter_Location_Data *)operator_new(0x40);
    Am_Inter_Location_Data(this_00,this);
  }
  return &this_00->super_Am_Wrapper;
}

Assistant:

void
Am_Inter_Location_Data::Print(std::ostream &os) const
{
  os << "(";
  if (as_line) {
    os << data.line.x1 << "," << data.line.y1 << ").(" << data.line.x2 << ","
       << data.line.y2 << ")";
  } else if (growing)
    os << data.rect.left << "," << data.rect.top << "," << data.rect.width
       << "," << data.rect.height << ")";
  else
    os << data.rect.left << "," << data.rect.top << ")";
  os << " w.r.t. " << ref_obj;
}